

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comex.c
# Opt level: O3

int comex_fence_all(comex_group_t group)

{
  bool bVar1;
  char *pcVar2;
  int iVar3;
  int *notify;
  long lVar4;
  ulong uVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  
  if (0 < (long)l_state.size) {
    lVar4 = 0;
    iVar7 = 0;
    do {
      iVar7 = (iVar7 + 1) - (uint)(fence_array[lVar4] == '\0');
      lVar4 = lVar4 + 1;
    } while (l_state.size != lVar4);
    if (iVar7 != 0) {
      notify = (int *)_my_malloc(4);
      *notify = iVar7;
      iVar3 = l_state.size;
      if (l_state.size < 1) {
        bVar1 = true;
      }
      else {
        uVar5 = (ulong)(uint)l_state.rank;
        uVar8 = 0;
        do {
          if ((uVar8 != uVar5) && (fence_array[uVar8] != '\0')) {
            _send_fence_message((int)uVar8,notify);
            uVar5 = (ulong)(uint)l_state.rank;
            iVar3 = l_state.size;
          }
          uVar8 = uVar8 + 1;
        } while ((long)uVar8 < (long)iVar3);
        bVar1 = 0 < *notify;
      }
      if (bVar1) {
        do {
          comex_make_progress();
          iVar3 = l_state.size;
        } while (0 < *notify);
      }
      pcVar2 = fence_array;
      if (iVar3 < 1) {
        iVar6 = 0;
      }
      else {
        lVar4 = 0;
        iVar6 = 0;
        do {
          if (pcVar2[lVar4] != '\0') {
            pcVar2[lVar4] = '\0';
            iVar6 = iVar6 + 1;
            iVar3 = l_state.size;
          }
          lVar4 = lVar4 + 1;
        } while (lVar4 < iVar3);
      }
      if (iVar7 != iVar6) {
        __assert_fail("count_before == count_after",
                      "/workspace/llm4binary/github/license_c_cmakelists/GlobalArrays[P]ga/comex/src-mpi/comex.c"
                      ,0x43c,"int comex_fence_all(comex_group_t)");
      }
      free(notify);
    }
  }
  return 0;
}

Assistant:

int comex_fence_all(comex_group_t group)
{
    int p = 0;
    int count_before = 0;
    int count_after = 0;
    int *notify = NULL;

#if DEBUG
    printf("[%d] comex_fence_all()\n", l_state.rank);
#endif

    /* count how many fence messagse to send */
    for (p=0; p<l_state.size; ++p) {
        if (fence_array[p]) {
            ++count_before;
        }
    }

    /* check for no outstanding put/get requests */
    if (0 == count_before) {
        return COMEX_SUCCESS;
    }

    /* we allocate the notifier on the heap in order to avoid reentry
     * into this function causing the same stack address to be reused */
    notify = _my_malloc(sizeof(int));
    assert(notify);
    *notify = count_before;

    /* optimize by only sending to procs which we have outstanding messages */
    for (p=0; p<l_state.size; ++p) {
        if (p == l_state.rank) {
            continue;
        }
        if (fence_array[p]) {
            _send_fence_message(p, notify);
        }
    }

    while (*notify > 0) {
        comex_make_progress();
#if DEBUG
        printf("[%d] are we stuck? notify=%d\n", l_state.rank, *notify);
#endif
    }

    for (p=0; p<l_state.size; ++p) {
        if (fence_array[p]) {
            fence_array[p] = 0;
            ++count_after;
        }
    }
    assert(count_before == count_after);

    _my_free(notify);

    return COMEX_SUCCESS;
}